

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_36::WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::
unsetCurrentWrapper(WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> *this,
                   Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *weakRef)

{
  int in_EDX;
  char *in_R8;
  char *in_R9;
  Fault f;
  DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_*,_kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_*>
  _kjCondition;
  DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_*,_kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_*>
  *in_stack_ffffffffffffffa8;
  char (*in_stack_ffffffffffffffb0) [63];
  Fault local_40;
  Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&> local_38;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *pMStack_30;
  char *local_28;
  undefined8 local_20;
  undefined1 local_18;
  
  local_38.ptr = (this->currentWrapper).ptr;
  if (local_38.ptr == (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0) {
    local_40.exception = (Exception *)0x0;
    local_38.ptr = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
    pMStack_30 = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
    kj::_::Debug::Fault::init
              (&local_40,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
              );
    kj::_::Debug::Fault::fatal(&local_40);
  }
  local_28 = " == ";
  local_20 = 5;
  local_18 = local_38.ptr == weakRef;
  if ((bool)local_18) {
    weakRef->ptr = (HttpInputStreamImpl *)0x0;
    (this->currentWrapper).ptr = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
    return;
  }
  pMStack_30 = weakRef;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>*,kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>*>&,char_const(&)[63]>
            (&local_40,(char *)&local_38,in_EDX,0x4d6514,in_R8,in_R9,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffb0);
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

void unsetCurrentWrapper(kj::Maybe<Subclass&>& weakRef) {
    auto& current = KJ_ASSERT_NONNULL(currentWrapper);
    KJ_ASSERT(&current == &weakRef,
        "bug in KJ HTTP: unsetCurrentWrapper() passed the wrong wrapper");
    weakRef = kj::none;
    currentWrapper = kj::none;
  }